

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O1

void __thiscall
CTcTokenizer::add_define(CTcTokenizer *this,char *sym,size_t len,char *expansion,size_t expan_len)

{
  CTcHashEntryPpDefine *this_00;
  
  this_00 = (CTcHashEntryPpDefine *)operator_new(0x68);
  CTcHashEntryPpDefine::CTcHashEntryPpDefine
            (this_00,sym,len,1,0,0,0,(char **)0x0,(size_t *)0x0,expansion,expan_len);
  (*this->defines_->_vptr_CTcMacroTable[2])(this->defines_,this_00);
  return;
}

Assistant:

void CTcTokenizer::add_define(const char *sym, size_t len,
                              const char *expansion, size_t expan_len)
{
    CTcHashEntryPp *entry;
    
    /* create an entry for the macro, with no argument list */
    entry = new CTcHashEntryPpDefine(sym, len, TRUE, FALSE, 0, FALSE, 0, 0,
                                     expansion, expan_len);

    /* add the new entry to the table */
    defines_->add(entry);
}